

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gus_pat.cpp
# Opt level: O3

int convert_8srp(uchar *data,_sample *gus_sample)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  short *psVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  byte *pbVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  
  uVar3 = gus_sample->loop_end;
  uVar4 = gus_sample->data_length;
  uVar16 = (ulong)uVar4;
  uVar5 = gus_sample->loop_start;
  uVar9 = (ulong)(uVar3 - uVar5);
  psVar7 = (short *)calloc(uVar16 + uVar9 * 2 + 2,2);
  gus_sample->data = psVar7;
  if (psVar7 == (short *)0x0) {
    piVar8 = __errno_location();
    _WM_ERROR("convert_8srp",0xcc,1,"to parse sample",*piVar8);
    iVar6 = -1;
  }
  else {
    lVar1 = uVar9 * 2;
    uVar12 = uVar9 * 4 ^ 0xfffffffffffffffc;
    lVar15 = -1;
    lVar10 = 0;
    do {
      psVar7[lVar10] = (ushort)data[lVar15 + uVar16] << 8;
      lVar10 = lVar10 + 1;
      uVar12 = uVar12 - 2;
      lVar15 = lVar15 + -1;
    } while (~(ulong)uVar3 + uVar16 != lVar10);
    pbVar13 = data + (uVar16 - lVar10) + -2;
    bVar2 = data[uVar3];
    psVar7[lVar10] = (ushort)bVar2 << 8;
    psVar7[lVar10 + uVar9 * 2] = (ushort)bVar2 << 8;
    lVar14 = lVar1 + lVar10 + 1;
    lVar15 = lVar1 + lVar10;
    do {
      lVar11 = lVar10;
      lVar15 = lVar15 + -1;
      bVar2 = *pbVar13;
      pbVar13 = pbVar13 + -1;
      psVar7[lVar11 + 1] = (ushort)bVar2 << 8;
      psVar7[lVar15] = (ushort)bVar2 << 8;
      psVar7[lVar14] = psVar7[lVar11 + 1];
      uVar12 = uVar12 - 2;
      lVar10 = lVar11 + 1;
      lVar14 = lVar14 + 1;
    } while ((uVar16 - uVar5) + -2 != lVar10);
    bVar2 = data[uVar5];
    psVar7[lVar11 + 2] = (ushort)bVar2 << 8;
    psVar7[lVar14] = (ushort)bVar2 << 8;
    psVar7 = (short *)((long)psVar7 - uVar12);
    lVar10 = -lVar10;
    do {
      *psVar7 = (ushort)data[lVar10 + (uVar16 - 3)] << 8;
      lVar10 = lVar10 + -1;
      psVar7 = psVar7 + 2;
    } while (2 - uVar16 != lVar10);
    gus_sample->loop_start = uVar3;
    gus_sample->loop_end = (int)lVar1 + uVar3;
    gus_sample->data_length = uVar4 + (uVar3 - uVar5) * 2;
    gus_sample->modes = gus_sample->modes ^ 0x18;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int convert_8srp(unsigned char *data, struct _sample *gus_sample) {
	unsigned long int loop_length = gus_sample->loop_end
			- gus_sample->loop_start;
	unsigned long int dloop_length = loop_length * 2;
	unsigned long int new_length = gus_sample->data_length + dloop_length;
	unsigned char *read_data = data + gus_sample->data_length - 1;
	unsigned char *read_end = data + gus_sample->loop_end;
	signed short int *write_data = NULL;
	signed short int *write_data_a = NULL;
	signed short int *write_data_b = NULL;

	SAMPLE_CONVERT_DEBUG(__FUNCTION__);
	gus_sample->data = (short*)calloc((new_length + 2), sizeof(signed short int));
	if (gus_sample->data != NULL) {
		write_data = gus_sample->data;
		do {
			*write_data++ = (*read_data--) << 8;
		} while (read_data != read_end);

		*write_data = (*read_data-- << 8);
		write_data_a = write_data + dloop_length;
		*write_data_a-- = *write_data;
		write_data++;
		write_data_b = write_data + dloop_length;
		read_end = data + gus_sample->loop_start;
		do {
			*write_data = (*read_data--) << 8;
			*write_data_a-- = *write_data;
			*write_data_b++ = *write_data;
			write_data++;
		} while (read_data != read_end);

		*write_data = (*read_data-- << 8);
		*write_data_b++ = *write_data;
		read_end = data - 1;
		do {
			*write_data_b++ = (*read_data--) << 8;
			write_data_b++;
		} while (read_data != read_end);
		gus_sample->loop_start += loop_length;
		gus_sample->loop_end += dloop_length;
		gus_sample->data_length = new_length;
		gus_sample->modes ^= SAMPLE_PINGPONG | SAMPLE_REVERSE;
		return 0;
	}

	_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_MEM, "to parse sample", errno);
	return -1;
}